

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_flight_transmit(mbedtls_ssl_context *ssl)

{
  uint8_t uVar1;
  mbedtls_ssl_flight_item *pmVar2;
  uchar *__src;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  undefined8 in_stack_ffffffffffffff78;
  ulong local_78;
  size_t max_hs_frag_len;
  size_t cur_hs_frag_len;
  size_t rem_len;
  size_t frag_off;
  size_t hs_len;
  uchar *p;
  int force_flush;
  int is_finished;
  mbedtls_ssl_flight_item *cur;
  size_t max_frag_len;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x9eb,"=> mbedtls_ssl_flight_transmit");
  if (ssl->handshake->retransmit_state != '\x01') {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x9ee,"initialise flight transmission");
    ssl->handshake->cur_msg = ssl->handshake->flight;
    ssl->handshake->cur_msg_p = ssl->handshake->flight->p + 0xc;
    iVar5 = ssl_swap_epochs(ssl);
    if (iVar5 != 0) {
      return iVar5;
    }
    ssl->handshake->retransmit_state = '\x01';
  }
  do {
    while( true ) {
      if (ssl->handshake->cur_msg == (mbedtls_ssl_flight_item *)0x0) {
        iVar5 = mbedtls_ssl_flush_output(ssl);
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar5 = mbedtls_ssl_is_handshake_over(ssl);
        if (iVar5 == 1) {
          ssl->handshake->retransmit_state = '\x03';
        }
        else {
          ssl->handshake->retransmit_state = '\x02';
          mbedtls_ssl_set_timer(ssl,ssl->handshake->retransmit_timeout);
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xa7c,"<= mbedtls_ssl_flight_transmit");
        return 0;
      }
      pmVar2 = ssl->handshake->cur_msg;
      bVar9 = false;
      if (pmVar2->type == '\x16') {
        bVar9 = *pmVar2->p == '\x14';
      }
      uVar1 = ssl->disable_datagram_packing;
      if ((bVar9) && (ssl->handshake->cur_msg_p == pmVar2->p + 0xc)) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xa09,"swap epochs to send finished message");
        iVar5 = ssl_swap_epochs(ssl);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      iVar5 = ssl_get_remaining_payload_in_datagram(ssl);
      if (iVar5 < 0) {
        return iVar5;
      }
      uVar6 = (ulong)iVar5;
      if (pmVar2->type == '\x14') break;
      __src = ssl->handshake->cur_msg_p;
      uVar7 = pmVar2->len - 0xc;
      lVar8 = (long)__src - (long)(pmVar2->p + 0xc);
      local_78 = uVar7 - lVar8;
      if ((uVar6 < 0xc) || ((uVar6 == 0xc && (uVar7 != 0)))) {
        if ((bVar9) && (iVar5 = ssl_swap_epochs(ssl), iVar5 != 0)) {
          return iVar5;
        }
        iVar5 = mbedtls_ssl_flush_output(ssl);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      else {
        uVar6 = uVar6 - 0xc;
        if (uVar6 < local_78) {
          local_78 = uVar6;
        }
        if ((lVar8 == 0) && (local_78 != uVar7)) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xa43,"fragmenting handshake message (%u > %u)",local_78 & 0xffffffff,
                     CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)uVar6));
        }
        puVar3 = ssl->out_msg;
        puVar4 = pmVar2->p;
        *(undefined4 *)puVar3 = *(undefined4 *)puVar4;
        *(undefined2 *)(puVar3 + 4) = *(undefined2 *)(puVar4 + 4);
        ssl->out_msg[6] = (uchar)((ulong)lVar8 >> 0x10);
        ssl->out_msg[7] = (uchar)((ulong)lVar8 >> 8);
        ssl->out_msg[8] = (uchar)lVar8;
        ssl->out_msg[9] = (uchar)(local_78 >> 0x10);
        ssl->out_msg[10] = (uchar)(local_78 >> 8);
        ssl->out_msg[0xb] = (uchar)local_78;
        in_stack_ffffffffffffff78 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xa53,"handshake header",ssl->out_msg,0xc);
        memcpy(ssl->out_msg + 0xc,__src,local_78);
        ssl->out_msglen = local_78 + 0xc;
        ssl->out_msgtype = (uint)pmVar2->type;
        ssl->handshake->cur_msg_p = ssl->handshake->cur_msg_p + local_78;
LAB_003597ea:
        if (pmVar2->p + pmVar2->len <= ssl->handshake->cur_msg_p) {
          if (pmVar2->next == (mbedtls_ssl_flight_item *)0x0) {
            ssl->handshake->cur_msg = (mbedtls_ssl_flight_item *)0x0;
            ssl->handshake->cur_msg_p = (uchar *)0x0;
          }
          else {
            ssl->handshake->cur_msg = pmVar2->next;
            ssl->handshake->cur_msg_p = pmVar2->next->p + 0xc;
          }
        }
        iVar5 = mbedtls_ssl_write_record(ssl,(uint)(uVar1 == '\x01'));
        if (iVar5 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xa6b,"mbedtls_ssl_write_record",iVar5);
          return iVar5;
        }
      }
    }
    if (uVar6 != 0) {
      memcpy(ssl->out_msg,pmVar2->p,pmVar2->len);
      ssl->out_msglen = pmVar2->len;
      ssl->out_msgtype = (uint)pmVar2->type;
      ssl->handshake->cur_msg_p = ssl->handshake->cur_msg_p + pmVar2->len;
      goto LAB_003597ea;
    }
    iVar5 = mbedtls_ssl_flush_output(ssl);
    if (iVar5 != 0) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int mbedtls_ssl_flight_transmit(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_SSL_DEBUG_MSG(2, ("=> mbedtls_ssl_flight_transmit"));

    if (ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("initialise flight transmission"));

        ssl->handshake->cur_msg = ssl->handshake->flight;
        ssl->handshake->cur_msg_p = ssl->handshake->flight->p + 12;
        ret = ssl_swap_epochs(ssl);
        if (ret != 0) {
            return ret;
        }

        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_SENDING;
    }

    while (ssl->handshake->cur_msg != NULL) {
        size_t max_frag_len;
        const mbedtls_ssl_flight_item * const cur = ssl->handshake->cur_msg;

        int const is_finished =
            (cur->type == MBEDTLS_SSL_MSG_HANDSHAKE &&
             cur->p[0] == MBEDTLS_SSL_HS_FINISHED);

        int const force_flush = ssl->disable_datagram_packing == 1 ?
                                SSL_FORCE_FLUSH : SSL_DONT_FORCE_FLUSH;

        /* Swap epochs before sending Finished: we can't do it after
         * sending ChangeCipherSpec, in case write returns WANT_READ.
         * Must be done before copying, may change out_msg pointer */
        if (is_finished && ssl->handshake->cur_msg_p == (cur->p + 12)) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("swap epochs to send finished message"));
            ret = ssl_swap_epochs(ssl);
            if (ret != 0) {
                return ret;
            }
        }

        ret = ssl_get_remaining_payload_in_datagram(ssl);
        if (ret < 0) {
            return ret;
        }
        max_frag_len = (size_t) ret;

        /* CCS is copied as is, while HS messages may need fragmentation */
        if (cur->type == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC) {
            if (max_frag_len == 0) {
                if ((ret = mbedtls_ssl_flush_output(ssl)) != 0) {
                    return ret;
                }

                continue;
            }

            memcpy(ssl->out_msg, cur->p, cur->len);
            ssl->out_msglen  = cur->len;
            ssl->out_msgtype = cur->type;

            /* Update position inside current message */
            ssl->handshake->cur_msg_p += cur->len;
        } else {
            const unsigned char * const p = ssl->handshake->cur_msg_p;
            const size_t hs_len = cur->len - 12;
            const size_t frag_off = p - (cur->p + 12);
            const size_t rem_len = hs_len - frag_off;
            size_t cur_hs_frag_len, max_hs_frag_len;

            if ((max_frag_len < 12) || (max_frag_len == 12 && hs_len != 0)) {
                if (is_finished) {
                    ret = ssl_swap_epochs(ssl);
                    if (ret != 0) {
                        return ret;
                    }
                }

                if ((ret = mbedtls_ssl_flush_output(ssl)) != 0) {
                    return ret;
                }

                continue;
            }
            max_hs_frag_len = max_frag_len - 12;

            cur_hs_frag_len = rem_len > max_hs_frag_len ?
                              max_hs_frag_len : rem_len;

            if (frag_off == 0 && cur_hs_frag_len != hs_len) {
                MBEDTLS_SSL_DEBUG_MSG(2, ("fragmenting handshake message (%u > %u)",
                                          (unsigned) cur_hs_frag_len,
                                          (unsigned) max_hs_frag_len));
            }

            /* Messages are stored with handshake headers as if not fragmented,
             * copy beginning of headers then fill fragmentation fields.
             * Handshake headers: type(1) len(3) seq(2) f_off(3) f_len(3) */
            memcpy(ssl->out_msg, cur->p, 6);

            ssl->out_msg[6] = MBEDTLS_BYTE_2(frag_off);
            ssl->out_msg[7] = MBEDTLS_BYTE_1(frag_off);
            ssl->out_msg[8] = MBEDTLS_BYTE_0(frag_off);

            ssl->out_msg[9] = MBEDTLS_BYTE_2(cur_hs_frag_len);
            ssl->out_msg[10] = MBEDTLS_BYTE_1(cur_hs_frag_len);
            ssl->out_msg[11] = MBEDTLS_BYTE_0(cur_hs_frag_len);

            MBEDTLS_SSL_DEBUG_BUF(3, "handshake header", ssl->out_msg, 12);

            /* Copy the handshake message content and set records fields */
            memcpy(ssl->out_msg + 12, p, cur_hs_frag_len);
            ssl->out_msglen = cur_hs_frag_len + 12;
            ssl->out_msgtype = cur->type;

            /* Update position inside current message */
            ssl->handshake->cur_msg_p += cur_hs_frag_len;
        }

        /* If done with the current message move to the next one if any */
        if (ssl->handshake->cur_msg_p >= cur->p + cur->len) {
            if (cur->next != NULL) {
                ssl->handshake->cur_msg = cur->next;
                ssl->handshake->cur_msg_p = cur->next->p + 12;
            } else {
                ssl->handshake->cur_msg = NULL;
                ssl->handshake->cur_msg_p = NULL;
            }
        }

        /* Actually send the message out */
        if ((ret = mbedtls_ssl_write_record(ssl, force_flush)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_record", ret);
            return ret;
        }
    }

    if ((ret = mbedtls_ssl_flush_output(ssl)) != 0) {
        return ret;
    }

    /* Update state and set timer */
    if (mbedtls_ssl_is_handshake_over(ssl) == 1) {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    } else {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;
        mbedtls_ssl_set_timer(ssl, ssl->handshake->retransmit_timeout);
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= mbedtls_ssl_flight_transmit"));

    return 0;
}